

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcParser::CTcParser(CTcParser *this)

{
  void *pvVar1;
  long in_RDI;
  size_t i;
  CTcPrsMem *in_stack_ffffffffffffffe0;
  CTcPrsSymtab *in_stack_ffffffffffffffe8;
  CTcPrsSymtab *in_stack_fffffffffffffff0;
  ulong uVar2;
  
  *(undefined8 *)(in_RDI + 600) = 0;
  *(undefined4 *)(in_RDI + 0x260) = 0;
  *(byte *)(in_RDI + 0xec) = *(byte *)(in_RDI + 0xec) & 0xfe;
  *(byte *)(in_RDI + 0xec) = *(byte *)(in_RDI + 0xec) & 0xfd;
  pvVar1 = CTcPrsSymtab::operator_new(0x2a1660);
  CTcPrsSymtab::CTcPrsSymtab(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  *(void **)(in_RDI + 0x80) = pvVar1;
  *(undefined8 *)(in_RDI + 0x118) = 0;
  *(undefined8 *)(in_RDI + 0x120) = 0;
  *(undefined8 *)(in_RDI + 0x128) = 0;
  *(undefined8 *)(in_RDI + 0x130) = 0;
  *(undefined8 *)(in_RDI + 0x140) = 0;
  *(undefined8 *)(in_RDI + 0x138) = 0;
  *(undefined8 *)(in_RDI + 0x160) = 0;
  *(undefined4 *)(in_RDI + 0x168) = 0;
  *(undefined8 *)(in_RDI + 0x170) = 0;
  *(undefined8 *)(in_RDI + 0x150) = 0;
  *(undefined8 *)(in_RDI + 0x148) = 0;
  *(undefined8 *)(in_RDI + 0x158) = 0;
  *(undefined4 *)(in_RDI + 0x16c) = 0;
  *(undefined8 *)(in_RDI + 0x1b0) = 0;
  *(undefined8 *)(in_RDI + 0x1a8) = 0;
  *(undefined8 *)(in_RDI + 0x1c0) = 0x10;
  pvVar1 = CTcPrsMem::alloc(in_stack_ffffffffffffffe0,(size_t)pvVar1);
  *(void **)(in_RDI + 0x1b8) = pvVar1;
  *(undefined8 *)(in_RDI + 0x1d0) = 0;
  *(undefined8 *)(in_RDI + 0x1c8) = 0;
  *(undefined4 *)(in_RDI + 0x114) = 0;
  *(undefined4 *)(in_RDI + 0x110) = 0;
  *(undefined8 *)(in_RDI + 0xf8) = 0;
  *(undefined8 *)(in_RDI + 0x100) = 0;
  *(undefined8 *)(in_RDI + 0xf0) = 0;
  *(undefined8 *)(in_RDI + 0x108) = 0;
  *(byte *)(in_RDI + 0xec) = *(byte *)(in_RDI + 0xec) & 0xfe;
  *(byte *)(in_RDI + 0xec) = *(byte *)(in_RDI + 0xec) & 0xfb;
  *(undefined8 *)(in_RDI + 0x178) = 0;
  *(undefined8 *)(in_RDI + 0x180) = 0;
  *(undefined8 *)(in_RDI + 0x188) = 0;
  *(undefined8 *)(in_RDI + 400) = 0;
  *(undefined8 *)(in_RDI + 0x198) = 0;
  *(undefined8 *)(in_RDI + 0x1a0) = 0;
  *(undefined8 *)(in_RDI + 0x1f8) = 0x32;
  pvVar1 = malloc(*(long *)(in_RDI + 0x1f8) << 1);
  *(void **)(in_RDI + 0x1f0) = pvVar1;
  *(undefined8 *)(in_RDI + 0x200) = 0;
  *(undefined8 *)(in_RDI + 0x208) = 0;
  *(undefined4 *)(in_RDI + 0x210) = 2;
  *(undefined4 *)(in_RDI + 0x220) = 0;
  *(undefined8 *)(in_RDI + 0x238) = 1;
  *(undefined8 *)(in_RDI + 0x240) = 0;
  *(undefined8 *)(in_RDI + 0x1e0) = 0;
  *(undefined8 *)(in_RDI + 0x1d8) = 0;
  *(undefined8 *)(in_RDI + 0x250) = 0x20;
  pvVar1 = malloc(*(long *)(in_RDI + 0x250) << 3);
  *(void **)(in_RDI + 0x248) = pvVar1;
  for (uVar2 = 0; uVar2 < *(ulong *)(in_RDI + 0x250); uVar2 = uVar2 + 1) {
    *(undefined8 *)(*(long *)(in_RDI + 0x248) + uVar2 * 8) = 0;
  }
  *(undefined8 *)(in_RDI + 0x218) = 0;
  *(undefined4 *)(in_RDI + 0x224) = 0;
  *(undefined4 *)(in_RDI + 0x22c) = 0;
  *(undefined4 *)(in_RDI + 0x228) = 0;
  *(undefined4 *)(in_RDI + 0x230) = 0;
  pvVar1 = operator_new(0x18);
  CTcEmbedTokenList::CTcEmbedTokenList((CTcEmbedTokenList *)in_stack_ffffffffffffffe0);
  *(void **)(in_RDI + 0x78) = pvVar1;
  return;
}

Assistant:

CTcParser::CTcParser()
{
    size_t i;
    
    /* we don't have any module information yet */
    module_name_ = 0;
    module_seqno_ = 0;

    /* start out in normal mode */
    pp_expr_mode_ = FALSE;
    src_group_mode_ = FALSE;

    /* create the global symbol table */
    global_symtab_ = new CTcPrsSymtab(0);

    /* no enclosing statement yet */
    enclosing_stm_ = 0;

    /* no source location yet */
    cur_desc_ = 0;
    cur_linenum_ = 0;

    /* no dictionaries yet */
    dict_cur_ = 0;
    dict_head_ = dict_tail_ = 0;

    /* no object file dictionary list yet */
    obj_dict_list_ = 0;
    obj_file_dict_idx_ = 0;

    /* no dictionary properties yet */
    dict_prop_head_ = 0;

    /* no grammar productions yet */
    gramprod_head_ = gramprod_tail_ = 0;

    /* no object file symbol list yet */
    obj_sym_list_ = 0;
    obj_file_sym_idx_ = 0;

    /* no object templates yet */
    template_head_ = template_tail_ = 0;

    /* allocate some initial template parsing space */
    template_expr_max_ = 16;
    template_expr_ = (CTcObjTemplateInst *)G_prsmem->
                     alloc(sizeof(template_expr_[0]) * template_expr_max_);

    /* no string templates yet */
    str_template_head_ = str_template_tail_ = 0;

    /* no locals yet */
    local_cnt_ = max_local_cnt_ = 0;

    /* no local or goto symbol table yet */
    local_symtab_ = 0;
    enclosing_local_symtab_ = 0;
    goto_symtab_ = 0;

    /* no debugger local symbol table yet */
    debug_symtab_ = 0;

    /* not in a preprocessor constant expression */
    pp_expr_mode_ = FALSE;

    /* assume we're doing full compilation */
    syntax_only_ = FALSE;

    /* no nested top-level statements yet */
    nested_stm_head_ = 0;
    nested_stm_tail_ = 0;

    /* no anonymous objects yet */
    anon_obj_head_ = 0;
    anon_obj_tail_ = 0;

    /* no non-symbol objects yet */
    nonsym_obj_head_ = 0;
    nonsym_obj_tail_ = 0;

    /* allocate an initial context variable property array */
    ctx_var_props_size_ = 50;
    ctx_var_props_ = (tctarg_prop_id_t *)
                     t3malloc(ctx_var_props_size_ * sizeof(tctarg_prop_id_t));

    /* no context variable properties assigned yet */
    ctx_var_props_cnt_ = 0;
    ctx_var_props_used_ = 0;

    /* 
     *   no context variable indices assigned yet - start at one higher
     *   than the index at which we always store 'self' 
     */
    next_ctx_arr_idx_ = TCPRS_LOCAL_CTX_METHODCTX + 1;

    /* 'self' isn't valid yet */
    self_valid_ = FALSE;

    /* start at enum ID 1 (let 0 serve as an invalid value) */
    next_enum_id_ = 1;

    /* the '+' property is not yet defined */
    plus_prop_ = 0;

    /* no exported symbols yet */
    exp_head_ = exp_tail_ = 0;

    /* allocate an initial '+' stack */
    plus_stack_alloc_ = 32;
    plus_stack_ = (CTPNStmObject **)
                  t3malloc(plus_stack_alloc_ * sizeof(*plus_stack_));

    /* clear out the stack */
    for (i = 0 ; i < plus_stack_alloc_ ; ++i)
        plus_stack_[i] = 0;

    /* there's no current code body (function/method body) yet */
    cur_code_body_ = 0;

    /* nothing in the local context has been referenced yet */
    self_referenced_ = FALSE;
    local_ctx_needs_self_ = FALSE;
    full_method_ctx_referenced_ = FALSE;
    local_ctx_needs_full_method_ctx_ = FALSE;

    /* create the embedded expression list object */
    embed_toks_ = new CTcEmbedTokenList();
}